

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# WebSocketContext.h
# Opt level: O3

WebSocketContext<false,_true> *
uWS::WebSocketContext<false,_true>::create(Loop *loop,us_socket_context_t *parentSocketContext)

{
  int iVar1;
  WebSocketContext<false,_true> *this;
  WebSocketContextData<false> *this_00;
  undefined4 extraout_var;
  WebSocketContext<false,_true> *ctx;
  
  this = (WebSocketContext<false,_true> *)
         us_create_child_socket_context(0,parentSocketContext,0x300);
  if (this != (WebSocketContext<false,_true> *)0x0) {
    ctx = this;
    this_00 = (WebSocketContextData<false> *)us_socket_context_ext(0);
    WebSocketContextData<false>::WebSocketContextData(this_00);
    iVar1 = init(this,(EVP_PKEY_CTX *)ctx);
    return (WebSocketContext<false,_true> *)CONCAT44(extraout_var,iVar1);
  }
  return (WebSocketContext<false,_true> *)0x0;
}

Assistant:

static WebSocketContext *create(Loop *loop, us_socket_context_t *parentSocketContext) {
        WebSocketContext *webSocketContext = (WebSocketContext *) us_create_child_socket_context(SSL, parentSocketContext, sizeof(WebSocketContextData<SSL>));
        if (!webSocketContext) {
            return nullptr;
        }

        /* Init socket context data */
        new ((WebSocketContextData<SSL> *) us_socket_context_ext(SSL, (us_socket_context_t *)webSocketContext)) WebSocketContextData<SSL>;
        return webSocketContext->init();
    }